

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::AppendGlobalGeneratorsDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  bool bVar3;
  pointer ppcVar4;
  cmDocumentationEntry e;
  string defaultName;
  cmDocumentationEntry local_a0;
  long *local_58 [2];
  long local_48 [2];
  pointer local_38;
  
  EvaluateDefaultGlobalGenerator((cmake *)&stack0xffffffffffffffc8);
  (*(code *)(*local_38)[3]._vptr_cmGlobalGeneratorFactory)(local_58);
  ppcVar4 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar2 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar4 != ppcVar2) {
    paVar1 = &local_a0.Brief.field_2;
    bVar3 = false;
    do {
      local_a0.Name._M_dataplus._M_p = (pointer)&local_a0.Name.field_2;
      local_a0.Name._M_string_length = 0;
      local_a0.Name.field_2._M_local_buf[0] = '\0';
      local_a0.Brief._M_string_length = 0;
      local_a0.Brief.field_2._M_local_buf[0] = '\0';
      local_a0.CustomNamePrefix = ' ';
      local_a0.Brief._M_dataplus._M_p = (pointer)paVar1;
      (*(*ppcVar4)->_vptr_cmGlobalGeneratorFactory[3])(*ppcVar4,&local_a0);
      if (bVar3) {
LAB_0016e6ed:
        bVar3 = true;
      }
      else {
        bVar3 = cmsys::SystemTools::StringStartsWith(&local_a0.Name,(char *)local_58[0]);
        if (bVar3) {
          local_a0.CustomNamePrefix = '*';
          goto LAB_0016e6ed;
        }
        bVar3 = false;
      }
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
      emplace_back<cmDocumentationEntry>(v,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.Brief._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0.Brief._M_dataplus._M_p,
                        CONCAT71(local_a0.Brief.field_2._M_allocated_capacity._1_7_,
                                 local_a0.Brief.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.Name._M_dataplus._M_p != &local_a0.Name.field_2) {
        operator_delete(local_a0.Name._M_dataplus._M_p,
                        CONCAT71(local_a0.Name.field_2._M_allocated_capacity._1_7_,
                                 local_a0.Name.field_2._M_local_buf[0]) + 1);
      }
      ppcVar4 = ppcVar4 + 1;
    } while (ppcVar4 != ppcVar2);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  (*(code *)(*local_38)[1]._vptr_cmGlobalGeneratorFactory)();
  return;
}

Assistant:

void cmake::AppendGlobalGeneratorsDocumentation(
  std::vector<cmDocumentationEntry>& v)
{
  const auto defaultGenerator = this->EvaluateDefaultGlobalGenerator();
  const std::string defaultName = defaultGenerator->GetName();
  bool foundDefaultOne = false;

  for (cmGlobalGeneratorFactory* g : this->Generators) {
    cmDocumentationEntry e;
    g->GetDocumentation(e);
    if (!foundDefaultOne &&
        cmSystemTools::StringStartsWith(e.Name, defaultName.c_str())) {
      e.CustomNamePrefix = '*';
      foundDefaultOne = true;
    }
    v.push_back(std::move(e));
  }
}